

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

float Abc_NtkComputeDelay(Abc_Ntk_t *pNtk)

{
  float fVar1;
  double dVar2;
  long *plVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  float *pfVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  float Delays [15];
  float local_58 [18];
  
  pfVar6 = local_58;
  local_58[0xc] = 0.0;
  local_58[0xd] = 0.0;
  local_58[0xe] = 0.0;
  local_58[8] = 0.0;
  local_58[9] = 0.0;
  local_58[10] = 0.0;
  local_58[0xb] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  uVar4 = Abc_NtkGetFaninMax(pNtk);
  if (0xc < uVar4 - 2) {
    __assert_fail("nFaninMax > 1 && nFaninMax < 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0x9c0,"float Abc_NtkComputeDelay(Abc_Ntk_t *)");
  }
  dVar2 = Abc_NtkComputeDelay::GateDelays[uVar4];
  lVar9 = 0;
  do {
    *pfVar6 = (float)(*(double *)((long)Abc_NtkComputeDelay::GateDelays + lVar9) / dVar2);
    pfVar6 = pfVar6 + 1;
    lVar9 = lVar9 + 8;
  } while ((ulong)uVar4 * 8 + 8 != lVar9);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      *(undefined4 *)((long)pVVar5->pArray[lVar9] + 0x40) = 0;
      lVar9 = lVar9 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar9 < pVVar5->nSize);
  }
  pVVar5 = Abc_NtkDfs(pNtk,1);
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      plVar3 = (long *)pVVar5->pArray[lVar9];
      *(undefined4 *)(plVar3 + 8) = 0;
      iVar8 = *(int *)((long)plVar3 + 0x1c);
      if (0 < iVar8) {
        fVar10 = *(float *)(plVar3 + 8);
        lVar7 = 0;
        do {
          fVar1 = *(float *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                      (long)*(int *)(plVar3[4] + lVar7 * 4) * 8) + 0x40);
          if (fVar10 <= fVar1) {
            fVar10 = fVar1;
          }
          *(float *)(plVar3 + 8) = fVar10;
          lVar7 = lVar7 + 1;
          iVar8 = *(int *)((long)plVar3 + 0x1c);
        } while (lVar7 < iVar8);
      }
      *(float *)(plVar3 + 8) = local_58[iVar8] + *(float *)(plVar3 + 8);
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar5->nSize);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    free(pVVar5);
  }
  lVar9 = (long)pNtk->vCos->nSize;
  if (lVar9 < 1) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = 0.0;
    lVar7 = 0;
    do {
      plVar3 = (long *)pNtk->vCos->pArray[lVar7];
      fVar1 = *(float *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                  (long)*(int *)plVar3[4] * 8) + 0x40);
      if (fVar10 <= fVar1) {
        fVar10 = fVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  return fVar10;
}

Assistant:

float Abc_NtkComputeDelay( Abc_Ntk_t * pNtk )
{
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanin;
    float DelayMax, Delays[15] = {0};
    int nFaninMax, i, k;
    // calculate relative gate delays
    nFaninMax = Abc_NtkGetFaninMax( pNtk );
    assert( nFaninMax > 1 && nFaninMax < 15 );
    for ( i = 0; i <= nFaninMax; i++ )
        Delays[i] = GateDelays[i]/GateDelays[nFaninMax];
    // set max CI delay
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->dTemp = 0.0;
    // compute delays for each node
    vNodes = Abc_NtkDfs( pNtk, 1 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->dTemp = 0.0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            pObj->dTemp = Abc_MaxFloat( pObj->dTemp, pFanin->dTemp );
        pObj->dTemp += Delays[Abc_ObjFaninNum(pObj)];
    }
    Vec_PtrFree( vNodes );
    DelayMax = 0.0;
    // find max CO delay
    Abc_NtkForEachCo( pNtk, pObj, i )
        DelayMax = Abc_MaxFloat( DelayMax, Abc_ObjFanin0(pObj)->dTemp );
    return DelayMax;
}